

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

void __thiscall icu_63::Formattable::dispose(Formattable *this)

{
  Type TVar1;
  long lVar2;
  CharString *this_00;
  void *in_RSI;
  long lVar3;
  
  TVar1 = this->fType;
  if (TVar1 != kObject) {
    if (TVar1 == kArray) {
      lVar2 = (this->fValue).fInt64;
      if (lVar2 != 0) {
        if (*(long *)(lVar2 + -8) != 0) {
          lVar3 = *(long *)(lVar2 + -8) * 0x70;
          do {
            ~Formattable((Formattable *)(lVar2 + -0x70 + lVar3));
            lVar3 = lVar3 + -0x70;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)(lVar2 + -8),in_RSI);
      }
      goto LAB_0021ec4d;
    }
    if (TVar1 != kString) goto LAB_0021ec4d;
  }
  if ((this->fValue).fObject != (UObject *)0x0) {
    (*((this->fValue).fObject)->_vptr_UObject[1])();
  }
LAB_0021ec4d:
  this->fType = kLong;
  (this->fValue).fObject = (UObject *)0x0;
  this_00 = this->fDecimalStr;
  if (this_00 != (CharString *)0x0) {
    MaybeStackArray<char,_40>::~MaybeStackArray(&this_00->buffer);
  }
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  this->fDecimalStr = (CharString *)0x0;
  if (this->fDecimalQuantity != (DecimalQuantity *)0x0) {
    (*(this->fDecimalQuantity->super_IFixedDecimal)._vptr_IFixedDecimal[1])();
  }
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  return;
}

Assistant:

void Formattable::dispose()
{
    // Deletes the data value if necessary.
    switch (fType) {
    case kString:
        delete fValue.fString;
        break;
    case kArray:
        delete[] fValue.fArrayAndCount.fArray;
        break;
    case kObject:
        delete fValue.fObject;
        break;
    default:
        break;
    }

    fType = kLong;
    fValue.fInt64 = 0;

    delete fDecimalStr;
    fDecimalStr = NULL;

    delete fDecimalQuantity;
    fDecimalQuantity = NULL;
}